

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_read_image.cxx
# Opt level: O1

Fl_RGB_Image *
traverse_to_gl_subwindows
          (Fl_Group *g,uchar *p,int x,int y,int w,int h,int alpha,Fl_RGB_Image *full_img)

{
  int iVar1;
  Fl_Widget *pFVar2;
  int w_00;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  Fl_Plugin *pFVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Fl_Window *pFVar7;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  uchar *puVar8;
  Fl_RGB_Image *pFVar9;
  Fl_Widget **ppFVar10;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  Fl_RGB_Image *pFVar11;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  int iVar12;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  long lVar13;
  undefined4 in_register_00000084;
  int iVar14;
  uchar *local_70;
  Fl_Plugin_Manager pm;
  
  iVar3 = (*(g->super_Fl_Widget)._vptr_Fl_Widget[9])();
  pFVar9 = full_img;
  if (CONCAT44(extraout_var,iVar3) == 0) {
    iVar3 = (*(g->super_Fl_Widget)._vptr_Fl_Widget[8])(g);
    if (CONCAT44(extraout_var_01,iVar3) != 0) {
      puVar8 = p;
      if (full_img != (Fl_RGB_Image *)0x0) {
        pFVar7 = Fl_Widget::window(&g->super_Fl_Widget);
        if (pFVar7 == (Fl_Window *)0x0) goto LAB_0019cbd0;
        pFVar7 = Fl_Widget::window(&g->super_Fl_Widget);
        iVar3 = (*(pFVar7->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[9])(pFVar7);
        if (CONCAT44(extraout_var_02,iVar3) == 0) goto LAB_0019cbd0;
        iVar3 = (*(g->super_Fl_Widget)._vptr_Fl_Widget[8])(g);
        Fl_Window::make_current((Fl_Window *)CONCAT44(extraout_var_03,iVar3));
        puVar8 = (uchar *)0x0;
      }
      puVar8 = read_win_rectangle(puVar8,x,y,w,h,alpha);
      pFVar9 = (Fl_RGB_Image *)operator_new(0x40);
      Fl_RGB_Image::Fl_RGB_Image(pFVar9,puVar8,w,h,4 - (uint)(alpha == 0),0);
      if (p == (uchar *)0x0 || full_img != (Fl_RGB_Image *)0x0) {
        pFVar9->alloc_array = 1;
      }
    }
  }
  else {
    Fl_Plugin_Manager::Fl_Plugin_Manager(&pm,"fltk:device");
    pFVar6 = Fl_Plugin_Manager::plugin(&pm,"opengl.device.fltk.org");
    if (pFVar6 != (Fl_Plugin *)0x0) {
      iVar3 = (*pFVar6->_vptr_Fl_Plugin[5])
                        (pFVar6,g,CONCAT44(in_register_00000014,x),CONCAT44(in_register_0000000c,y),
                         CONCAT44(in_register_00000084,w));
      pFVar9 = (Fl_RGB_Image *)CONCAT44(extraout_var_00,iVar3);
      if (full_img == (Fl_RGB_Image *)0x0) {
        local_70 = p;
        if (p == (uchar *)0x0) {
          local_70 = (uchar *)operator_new__((long)(int)((4 - (uint)(alpha == 0)) *
                                                         (pFVar9->super_Fl_Image).w_ *
                                                        (pFVar9->super_Fl_Image).h_));
        }
        pFVar11 = (Fl_RGB_Image *)operator_new(0x40);
        Fl_RGB_Image::Fl_RGB_Image
                  (pFVar11,local_70,(pFVar9->super_Fl_Image).w_,(pFVar9->super_Fl_Image).h_,
                   4 - (uint)(alpha == 0),0);
        if (p == (uchar *)0x0) {
          pFVar11->alloc_array = 1;
        }
        if (alpha != 0) {
          memset(local_70,alpha,
                 (long)((pFVar9->super_Fl_Image).w_ * (pFVar9->super_Fl_Image).h_ * 4));
        }
        write_image_inside(pFVar11,pFVar9,0,0);
        (*(pFVar9->super_Fl_Image)._vptr_Fl_Image[1])(pFVar9);
        pFVar9 = pFVar11;
      }
    }
    Fl_Plugin_Manager::~Fl_Plugin_Manager(&pm);
    if (pFVar6 == (Fl_Plugin *)0x0) {
      return full_img;
    }
  }
LAB_0019cbd0:
  iVar3 = g->children_;
  if (0 < (long)iVar3) {
    lVar13 = 0;
    do {
      ppFVar10 = Fl_Group::array(g);
      pFVar2 = ppFVar10[lVar13];
      if (((pFVar2->flags_ & 2) == 0) &&
         (iVar4 = (*pFVar2->_vptr_Fl_Widget[7])(pFVar2), CONCAT44(extraout_var_04,iVar4) != 0)) {
        iVar4 = (*pFVar2->_vptr_Fl_Widget[8])(pFVar2);
        if (CONCAT44(extraout_var_05,iVar4) == 0) {
          iVar4 = (*pFVar2->_vptr_Fl_Widget[7])(pFVar2);
          traverse_to_gl_subwindows
                    ((Fl_Group *)CONCAT44(extraout_var_08,iVar4),p,x,y,w,h,alpha,pFVar9);
        }
        else {
          iVar4 = pFVar2->x_;
          iVar12 = pFVar2->y_;
          iVar14 = x;
          if (x < iVar4) {
            iVar14 = iVar4;
          }
          iVar5 = iVar4 - iVar14;
          if (x <= iVar4) {
            iVar5 = 0;
          }
          iVar4 = y;
          if (y < iVar12) {
            iVar4 = iVar12;
          }
          iVar1 = pFVar2->w_;
          w_00 = (w + x) - iVar14;
          if (iVar5 + iVar1 + iVar14 <= w + x) {
            w_00 = iVar5 + iVar1;
          }
          iVar12 = iVar12 + pFVar2->h_;
          iVar5 = iVar12 - iVar4;
          if (iVar4 + iVar1 <= iVar12) {
            iVar5 = iVar1;
          }
          iVar12 = (h + y) - iVar4;
          if (iVar5 + iVar4 <= h + y) {
            iVar12 = iVar5;
          }
          if ((0 < w_00) && (0 < iVar12)) {
            iVar5 = (*pFVar2->_vptr_Fl_Widget[8])(pFVar2);
            pFVar11 = traverse_to_gl_subwindows
                                ((Fl_Group *)CONCAT44(extraout_var_06,iVar5),p,iVar14 - pFVar2->x_,
                                 iVar4 - pFVar2->y_,w_00,iVar12,alpha,pFVar9);
            if (pFVar11 != pFVar9) {
              iVar12 = (*pFVar2->_vptr_Fl_Widget[9])(pFVar2);
              if (CONCAT44(extraout_var_07,iVar12) == 0) {
                iVar4 = ((pFVar9->super_Fl_Image).h_ + y) - (iVar4 + (pFVar11->super_Fl_Image).h_);
              }
              else {
                iVar4 = iVar4 - y;
              }
              write_image_inside(pFVar9,pFVar11,iVar14 - x,iVar4);
              if (pFVar11 != (Fl_RGB_Image *)0x0) {
                (*(pFVar11->super_Fl_Image)._vptr_Fl_Image[1])(pFVar11);
              }
            }
          }
        }
      }
      lVar13 = lVar13 + 1;
    } while (iVar3 != lVar13);
  }
  return pFVar9;
}

Assistant:

static Fl_RGB_Image *traverse_to_gl_subwindows(Fl_Group *g, uchar *p, int x, int y, int w, int h, int alpha,
                                               Fl_RGB_Image *full_img)
{
  if ( g->as_gl_window() ) {
    Fl_Plugin_Manager pm("fltk:device");
    Fl_Device_Plugin *pi = (Fl_Device_Plugin*)pm.plugin("opengl.device.fltk.org");
    if (!pi) return full_img;
    Fl_RGB_Image *img = pi->rectangle_capture(g, x, y, w, h); // bottom to top image
    if (full_img) full_img = img; // top and bottom will be exchanged later
    else { // exchange top and bottom to get a proper FLTK image
      uchar *data = ( p ? p : new uchar[img->w() * img->h() * (alpha?4:3)] );
      full_img = new Fl_RGB_Image(data, img->w(), img->h(), alpha?4:3);
      if (!p) full_img->alloc_array = 1;
      if (alpha) memset(data, alpha, img->w() * img->h() * 4);
      write_image_inside(full_img, img, 0, 0);
      delete img;
    }
  }
  else if ( g->as_window() && (!full_img || (g->window() && g->window()->as_gl_window())) ) {
    // the starting window or one inside a GL window
    if (full_img) g->as_window()->make_current();
    uchar *image_data;
    int alloc_img = (full_img != NULL || p == NULL); // false means use p, don't alloc new memory for image
#ifdef __APPLE_CC__
    // on Darwin + X11, read_win_rectangle() sometimes returns NULL when there are subwindows
    do image_data = read_win_rectangle( (alloc_img ? NULL : p), x, y, w, h, alpha); while (!image_data);
#else
    image_data = read_win_rectangle( (alloc_img ? NULL : p), x, y, w, h, alpha);
#endif
    full_img = new Fl_RGB_Image(image_data, w, h, alpha?4:3);
    if (alloc_img) full_img->alloc_array = 1;
  }
  int n = g->children();
  for (int i = 0; i < n; i++) {
    Fl_Widget *c = g->child(i);
    if ( !c->visible() || !c->as_group()) continue;
    if ( c->as_window() ) {
      int origin_x = x; // compute intersection of x,y,w,h and the c window
      if (x < c->x()) origin_x = c->x();
      int origin_y = y;
      if (y < c->y()) origin_y = c->y();
      int width = c->w();
      if (origin_x + width > c->x() + c->w()) width = c->x() + c->w() - origin_x;
      if (origin_x + width > x + w) width = x + w - origin_x;
      int height = c->w();
      if (origin_y + height > c->y() + c->h()) height = c->y() + c->h() - origin_y;
      if (origin_y + height > y + h) height = y + h - origin_y;
      if (width > 0 && height > 0) {
        Fl_RGB_Image *img = traverse_to_gl_subwindows(c->as_window(), p, origin_x - c->x(),
                                                      origin_y - c->y(), width, height, alpha, full_img);
        if (img == full_img) continue;
        int top;
        if (c->as_gl_window()) {
          top = origin_y - y;
        } else {
          top = full_img->h() - (origin_y - y + img->h());
        }
        write_image_inside(full_img, img, origin_x - x, top);
        delete img;
      }
    }
    else traverse_to_gl_subwindows(c->as_group(), p, x, y, w, h, alpha, full_img);
  }
  return full_img;
}